

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathexpander.cpp
# Opt level: O1

void __thiscall PathExpander::addToPathlist(PathExpander *this,char *s)

{
  uint *puVar1;
  FString copy;
  FString FStack_18;
  
  FString::FString(&FStack_18,s);
  FString::ReplaceChars(&FStack_18,'\\','/');
  TArray<FString,_FString>::Grow(&this->PathList,1);
  FString::AttachToOther((this->PathList).Array + (this->PathList).Count,&FStack_18);
  puVar1 = &(this->PathList).Count;
  *puVar1 = *puVar1 + 1;
  FString::~FString(&FStack_18);
  return;
}

Assistant:

void PathExpander::addToPathlist(const char *s)
{
	FString copy = s;
	FixPathSeperator(copy);
	PathList.Push(copy);
}